

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu2_v2.c
# Opt level: O2

MPP_RET hal_h264e_vepu2_gen_regs_v2(void *hal,HalEncTask *task)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  EncRcTask *pEVar6;
  int *piVar7;
  int *piVar8;
  long lVar9;
  RK_U32 RVar10;
  RK_U8 RVar11;
  int iVar12;
  uint uVar13;
  RK_S32 RVar14;
  size_t sVar15;
  void *pvVar16;
  ulong uVar17;
  MppBuffer pvVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  long lVar26;
  undefined8 uVar27;
  RK_U8 dmv_qpel_penalty [128];
  RK_U8 dmv_penalty [128];
  
  pEVar6 = task->rc_task;
  piVar7 = *(int **)((long)hal + 0x260);
  piVar8 = *(int **)((long)hal + 0x268);
  lVar9 = *(long *)((long)hal + 0x270);
  uVar4 = piVar7[0xf];
  uVar5 = piVar7[0x10];
  sVar15 = mpp_packet_get_length(task->packet);
  if (*(int *)((long)hal + 0x144) != 0) {
    uVar5 = *(uint *)(*(long *)((long)hal + 0x260) + 0x3c);
    uVar4 = *(uint *)(*(long *)((long)hal + 0x260) + 0x40);
  }
  *(RK_S32 *)((long)hal + 0x198) = (pEVar6->info).quality_target;
  uVar1 = (pEVar6->info).quality_max;
  uVar2 = (pEVar6->info).quality_min;
  uVar27 = CONCAT44(uVar1,uVar2);
  *(undefined8 *)((long)hal + 0x19c) = uVar27;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu2_v2","enter %p\n","hal_h264e_vepu2_gen_regs_v2",hal);
  }
  if ((hal_h264e_debug & 8) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu2_v2","frame %d generate regs now","hal_h264e_vepu2_gen_regs_v2",
               (ulong)*(ushort *)((long)&pEVar6->frm + 6));
  }
  h264e_vepu_mbrc_prepare
            (*(HalH264eVepuMbRcCtx *)((long)hal + 0x2f8),(HalH264eVepuMbRc *)((long)hal + 0x198),
             task->rc_task);
  h264e_vepu_slice_split_cfg
            (*(H264eSlice **)((long)hal + 0x270),(HalH264eVepuMbRc *)((long)hal + 0x198),
             task->rc_task,*hal);
  pvVar18 = task->output;
  iVar12 = mpp_buffer_get_fd_with_caller(pvVar18,"setup_output_packet");
  uVar21 = (uint)sVar15;
  if (uVar21 == 0) {
    uVar22 = 0;
    uVar25 = 0;
  }
  else {
    pvVar16 = mpp_buffer_get_ptr_with_caller(pvVar18,"setup_output_packet");
    uVar22 = *(uint *)((long)pvVar16 + (ulong)(uVar21 & 0xfffffff8));
    uVar24 = *(uint *)((long)pvVar16 + (ulong)(uVar21 & 0xfffffff8) + 4);
    uVar25 = uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 | uVar22 << 0x18;
    uVar22 = uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 | (uVar24 & 0xff00) << 8 | uVar24 << 0x18;
  }
  uVar24 = uVar21 & 0xfffffff8;
  if ((hal_h264e_debug & 8) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu2_v2","offset %d offset8 %d\n","setup_output_packet",
               sVar15 & 0xffffffff,(ulong)uVar24);
  }
  *(int *)((long)hal + 0x434) = iVar12;
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 8),0x4d,uVar24);
  sVar15 = mpp_buffer_get_size_with_caller(pvVar18,"setup_output_packet");
  *(uint *)((long)hal + 0x3d4) = (int)sVar15 - uVar24 >> 3 & 0xfffffff8;
  if ((hal_h264e_debug & 8) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu2_v2","msb %08x lsb %08x","setup_output_packet",(ulong)uVar25,
               (ulong)uVar22);
  }
  RVar10 = hal_h264e_debug;
  *(uint *)((long)hal + 0x3cc) = uVar25;
  *(uint *)((long)hal + 0x3d0) = uVar22;
  uVar25 = uVar21 * 8 & 0x38;
  *(uint *)((long)hal + 0x214) = uVar21;
  *(uint *)((long)hal + 0x218) = uVar25 >> 3;
  *(undefined4 *)((long)hal + 0x21c) = 0;
  uVar21 = *(uint *)(*(long *)((long)hal + 0x260) + 0x3c);
  uVar22 = *(uint *)(*(long *)((long)hal + 0x260) + 0x40);
  lVar26 = *hal;
  iVar12 = *(int *)(lVar26 + 0x16c);
  uVar3 = *(ushort *)((long)&pEVar6->frm + 6);
  iVar20 = *(int *)(lVar26 + 0xc4);
  if ((RVar10 & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu2_v2","enter\n","setup_intra_refresh");
    lVar26 = *hal;
  }
  uVar24 = 0;
  if ((*(int *)(lVar26 + 0x164) == 0) || (((pEVar6->frm).val & 0x4000000000) == 0)) {
    uVar23 = 0;
    uVar13 = 0;
  }
  else {
    iVar20 = (int)((long)(ulong)uVar3 % (long)iVar20);
    if (*(int *)(lVar26 + 0x168) == 1) {
      uVar19 = iVar20 * iVar12 - 2;
      uVar23 = (iVar20 + 1) * iVar12 - 1;
      uVar24 = uVar21;
      if ((int)uVar19 < (int)uVar21) {
        uVar24 = uVar19;
      }
      if ((int)uVar23 < (int)uVar21) {
        uVar21 = uVar23;
      }
      if ((int)uVar23 < 0) {
        uVar21 = 0;
      }
      uVar13 = (uVar24 & 0xff) << 8;
      uVar23 = uVar22;
    }
    else {
      uVar23 = 0;
      uVar13 = 0;
      if (*(int *)(lVar26 + 0x168) != 0) goto LAB_002244c9;
      uVar19 = iVar20 * iVar12 - 2;
      uVar24 = (iVar20 + 1) * iVar12 - 1;
      uVar13 = uVar22;
      if ((int)uVar19 < (int)uVar22) {
        uVar13 = uVar19;
      }
      uVar13 = uVar13 << 0x18;
      if ((int)uVar24 < (int)uVar22) {
        uVar22 = uVar24;
      }
      uVar23 = uVar22;
      if ((int)uVar24 < 0) {
        uVar23 = 0;
      }
    }
    uVar24 = uVar21;
    if ((int)uVar19 < 0) {
      uVar13 = 0;
    }
  }
LAB_002244c9:
  *(uint *)((long)hal + 0x3b8) = uVar24 & 0xff | uVar13 | (uVar23 & 0xff) << 0x10;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu2_v2","leave, ret %d\n","setup_intra_refresh",0);
  }
  *(undefined4 *)((long)hal + 0x3d8) = 0x1000;
  *(undefined4 *)((long)hal + 0x3dc) = *(undefined4 *)((long)hal + 0x208);
  iVar20 = (*(uint *)(lVar9 + 0x40) & 3) * 0x200000;
  iVar12 = iVar20 + 0x100000;
  if (piVar8[2] == 0) {
    iVar12 = iVar20;
  }
  uVar22 = iVar12 + (uint)(0xe10 < uVar4 * uVar5) * 0x10000000;
  uVar21 = uVar22 + 0x20000;
  if (piVar8[0x11] == 0) {
    uVar21 = uVar22;
  }
  uVar22 = uVar21 + 0x10000;
  if (*piVar7 < 0x20) {
    uVar22 = uVar21;
  }
  *(uint *)((long)hal + 0x3ec) = (*(uint *)((long)hal + 0x210) & 0x7f) << 8 | uVar22;
  if (uVar4 + uVar5 < 0xc9) {
    uVar21 = (uint)(byte)(200 / (byte)(uVar4 + uVar5));
  }
  else {
    uVar21 = 1;
  }
  iVar12 = *(int *)((long)hal + 0x198);
  uVar22 = 0xff00;
  if (uVar21 * h264_skip_sad_penalty[iVar12] < 0xff) {
    uVar22 = uVar21 * h264_skip_sad_penalty[iVar12] * 0x100;
  }
  uVar21 = (-*(uint *)((long)hal + 0xe4) & 0xc) << 2;
  if ((*(uint *)((long)hal + 0xe4) & 0xf) == 0) {
    uVar21 = 0;
  }
  uVar24 = -*(uint *)((long)hal + 0xe8) & 0xf;
  if ((*(uint *)((long)hal + 0xe8) & 0xf) == 0) {
    uVar24 = 0;
  }
  *(uint *)((long)hal + 0x3f0) = uVar25 << 0x10 | uVar22 | uVar21 | uVar24;
  *(uint *)((long)hal + 0x3f4) = *(uint *)((long)hal + 0x108) & 0x3fff;
  *(uint *)((long)hal + 0x404) =
       (uint)*(ushort *)((long)hal + 0x1ac) | *(int *)((long)hal + 0x1a8) << 0x10;
  *(uint *)((long)hal + 0x408) =
       (uint)*(ushort *)((long)hal + 0x1b4) | *(int *)((long)hal + 0x1b0) << 0x10;
  *(uint *)((long)hal + 0x40c) =
       (uint)*(ushort *)((long)hal + 0x1bc) | *(int *)((long)hal + 0x1b8) << 0x10;
  *(uint *)((long)hal + 0x410) =
       (uint)*(ushort *)((long)hal + 0x1c4) | *(int *)((long)hal + 0x1c0) << 0x10;
  *(uint *)((long)hal + 0x414) =
       (uint)*(ushort *)((long)hal + 0x1cc) | *(int *)((long)hal + 0x1c8) << 0x10;
  *(uint *)((long)hal + 0x418) =
       (uint)*(ushort *)((long)hal + 0x1d4) | *(int *)((long)hal + 0x1d0) << 0x10;
  *(uint *)((long)hal + 0x41c) =
       (uint)*(ushort *)((long)hal + 0x1dc) | *(int *)((long)hal + 0x1d8) << 0x10;
  *(uint *)((long)hal + 0x420) =
       (uint)*(ushort *)((long)hal + 0x1e4) | *(int *)((long)hal + 0x1e0) << 0x10;
  *(uint *)((long)hal + 0x424) =
       *(uint *)((long)hal + 0x1ec) & 0xf |
       (*(uint *)((long)hal + 0x1f0) & 0xf) << 4 |
       (*(uint *)((long)hal + 500) & 0xf) << 8 |
       (*(uint *)((long)hal + 0x1f8) & 0xf) << 0xc |
       (*(uint *)((long)hal + 0x1fc) & 0xf) << 0x10 |
       (*(uint *)((long)hal + 0x200) & 0xf) << 0x14 | (*(uint *)((long)hal + 0x204) & 0xf) << 0x18;
  *(uint *)((long)hal + 0x428) =
       ((*(uint *)((long)hal + 0xe0) & 0xf) << 4 | (*(uint *)((long)hal + 0x20c) & 0x3f) << 0x18) +
       (*(uint *)((long)hal + 0x144) & 3) * 4 + 1;
  *(uint *)((long)hal + 0x42c) =
       (uint)(ushort)h264_inter_favor[iVar12] | h264_intra16_favor[iVar12] << 0x10;
  uVar25 = (piVar8[0xb] & 0x1fU) << 0xd |
           (*(uint *)(lVar9 + 0x4c) & 0xf) << 0x12 |
           (*(uint *)(lVar9 + 0x48) & 0xf) << 0x16 | piVar8[9] << 0x1a;
  uVar22 = *(uint *)(lVar9 + 0x6c) & 0xf;
  uVar21 = uVar25 + 0x20 + uVar22 * 2;
  if (*(int *)(lVar9 + 0x44) == 0) {
    uVar21 = uVar25 + uVar22 * 2;
  }
  *(uint *)((long)hal + 0x430) = piVar8[0xf] != 0 | uVar21;
  *(undefined8 *)((long)hal + 0x43c) = 0;
  if (*(MppBuffer *)((long)hal + 0x28) == (MppBuffer)0x0) {
    iVar12 = 0;
  }
  else {
    iVar12 = mpp_buffer_get_fd_with_caller
                       (*(MppBuffer *)((long)hal + 0x28),"hal_h264e_vepu2_gen_regs_v2");
  }
  *(int *)((long)hal + 0x444) = iVar12;
  uVar21 = (uVar4 & 0xff) << 8 | (uVar5 & 0xff) * 0x1010000 | uVar4 & 0xff;
  *(uint *)((long)hal + 0x448) = uVar21;
  *(uint *)((long)hal + 0x44c) = uVar21;
  *(undefined4 *)((long)hal + 0x478) = 0;
  *(uint *)((long)hal + 0x47c) =
       (uint)*(ushort *)((long)hal + 0x130) | *(int *)((long)hal + 0x134) << 0x10;
  *(uint *)((long)hal + 0x480) =
       (uint)*(ushort *)((long)hal + 0x138) | *(int *)((long)hal + 0x13c) << 0x10;
  *(uint *)((long)hal + 0x484) = (uint)*(ushort *)((long)hal + 0x140);
  *(uint *)((long)hal + 0x488) =
       *(byte *)((long)hal + 0x128) & 0x1f |
       (*(byte *)((long)hal + 0x129) & 0x1f) << 8 | (*(byte *)((long)hal + 0x12a) & 0x1f) << 0x10;
  iVar12 = *(int *)((long)hal + 0x198);
  *(RK_U32 *)((long)hal + 0x48c) =
       (h264_diff_mv_penalty[iVar12] & 0x3ff) * 0x200800 +
       (h264_diff_mv_penalty4p[iVar12] & 0x3ff) * 2 + 1;
  *(uint *)((long)hal + 0x490) =
       *(uint *)((long)hal + 0x1a4) & 0xfff |
       (*(uint *)((long)hal + 0x19c) & 0x3f) << 0xe |
       (*(uint *)((long)hal + 0x1a0) & 0x3f) << 0x14 | iVar12 << 0x1a;
  *(undefined4 *)((long)hal + 0x498) = 0xa00000;
  *(uint *)((long)hal + 0x4a4) =
       (*(byte *)((long)hal + 0x12d) & 1) * 0x20000000 +
       ((*(byte *)((long)hal + 300) & 1) << 0x1e | (uint)*(byte *)((long)hal + 299) << 0x1f) +
       0x1c000000;
  *(uint *)((long)hal + 0x4a8) =
       (uint)*(ushort *)(lVar9 + 0x34) |
       (h264_prev_mode_favor[iVar12] & 0xff) << 0x10 | *piVar8 << 0x18;
  *(undefined4 *)((long)hal + 0x4b4) = 0x400;
  dmv_penalty[0x70] = '\0';
  dmv_penalty[0x71] = '\0';
  dmv_penalty[0x72] = '\0';
  dmv_penalty[0x73] = '\0';
  dmv_penalty[0x74] = '\0';
  dmv_penalty[0x75] = '\0';
  dmv_penalty[0x76] = '\0';
  dmv_penalty[0x77] = '\0';
  dmv_penalty[0x78] = '\0';
  dmv_penalty[0x79] = '\0';
  dmv_penalty[0x7a] = '\0';
  dmv_penalty[0x7b] = '\0';
  dmv_penalty[0x7c] = '\0';
  dmv_penalty[0x7d] = '\0';
  dmv_penalty[0x7e] = '\0';
  dmv_penalty[0x7f] = '\0';
  dmv_penalty[0x60] = '\0';
  dmv_penalty[0x61] = '\0';
  dmv_penalty[0x62] = '\0';
  dmv_penalty[99] = '\0';
  dmv_penalty[100] = '\0';
  dmv_penalty[0x65] = '\0';
  dmv_penalty[0x66] = '\0';
  dmv_penalty[0x67] = '\0';
  dmv_penalty[0x68] = '\0';
  dmv_penalty[0x69] = '\0';
  dmv_penalty[0x6a] = '\0';
  dmv_penalty[0x6b] = '\0';
  dmv_penalty[0x6c] = '\0';
  dmv_penalty[0x6d] = '\0';
  dmv_penalty[0x6e] = '\0';
  dmv_penalty[0x6f] = '\0';
  dmv_penalty[0x50] = '\0';
  dmv_penalty[0x51] = '\0';
  dmv_penalty[0x52] = '\0';
  dmv_penalty[0x53] = '\0';
  dmv_penalty[0x54] = '\0';
  dmv_penalty[0x55] = '\0';
  dmv_penalty[0x56] = '\0';
  dmv_penalty[0x57] = '\0';
  dmv_penalty[0x58] = '\0';
  dmv_penalty[0x59] = '\0';
  dmv_penalty[0x5a] = '\0';
  dmv_penalty[0x5b] = '\0';
  dmv_penalty[0x5c] = '\0';
  dmv_penalty[0x5d] = '\0';
  dmv_penalty[0x5e] = '\0';
  dmv_penalty[0x5f] = '\0';
  dmv_penalty[0x40] = '\0';
  dmv_penalty[0x41] = '\0';
  dmv_penalty[0x42] = '\0';
  dmv_penalty[0x43] = '\0';
  dmv_penalty[0x44] = '\0';
  dmv_penalty[0x45] = '\0';
  dmv_penalty[0x46] = '\0';
  dmv_penalty[0x47] = '\0';
  dmv_penalty[0x48] = '\0';
  dmv_penalty[0x49] = '\0';
  dmv_penalty[0x4a] = '\0';
  dmv_penalty[0x4b] = '\0';
  dmv_penalty[0x4c] = '\0';
  dmv_penalty[0x4d] = '\0';
  dmv_penalty[0x4e] = '\0';
  dmv_penalty[0x4f] = '\0';
  dmv_penalty[0x30] = '\0';
  dmv_penalty[0x31] = '\0';
  dmv_penalty[0x32] = '\0';
  dmv_penalty[0x33] = '\0';
  dmv_penalty[0x34] = '\0';
  dmv_penalty[0x35] = '\0';
  dmv_penalty[0x36] = '\0';
  dmv_penalty[0x37] = '\0';
  dmv_penalty[0x38] = '\0';
  dmv_penalty[0x39] = '\0';
  dmv_penalty[0x3a] = '\0';
  dmv_penalty[0x3b] = '\0';
  dmv_penalty[0x3c] = '\0';
  dmv_penalty[0x3d] = '\0';
  dmv_penalty[0x3e] = '\0';
  dmv_penalty[0x3f] = '\0';
  dmv_penalty[0x20] = '\0';
  dmv_penalty[0x21] = '\0';
  dmv_penalty[0x22] = '\0';
  dmv_penalty[0x23] = '\0';
  dmv_penalty[0x24] = '\0';
  dmv_penalty[0x25] = '\0';
  dmv_penalty[0x26] = '\0';
  dmv_penalty[0x27] = '\0';
  dmv_penalty[0x28] = '\0';
  dmv_penalty[0x29] = '\0';
  dmv_penalty[0x2a] = '\0';
  dmv_penalty[0x2b] = '\0';
  dmv_penalty[0x2c] = '\0';
  dmv_penalty[0x2d] = '\0';
  dmv_penalty[0x2e] = '\0';
  dmv_penalty[0x2f] = '\0';
  dmv_penalty[0x10] = '\0';
  dmv_penalty[0x11] = '\0';
  dmv_penalty[0x12] = '\0';
  dmv_penalty[0x13] = '\0';
  dmv_penalty[0x14] = '\0';
  dmv_penalty[0x15] = '\0';
  dmv_penalty[0x16] = '\0';
  dmv_penalty[0x17] = '\0';
  dmv_penalty[0x18] = '\0';
  dmv_penalty[0x19] = '\0';
  dmv_penalty[0x1a] = '\0';
  dmv_penalty[0x1b] = '\0';
  dmv_penalty[0x1c] = '\0';
  dmv_penalty[0x1d] = '\0';
  dmv_penalty[0x1e] = '\0';
  dmv_penalty[0x1f] = '\0';
  dmv_penalty[0] = '\0';
  dmv_penalty[1] = '\0';
  dmv_penalty[2] = '\0';
  dmv_penalty[3] = '\0';
  dmv_penalty[4] = '\0';
  dmv_penalty[5] = '\0';
  dmv_penalty[6] = '\0';
  dmv_penalty[7] = '\0';
  dmv_penalty[8] = '\0';
  dmv_penalty[9] = '\0';
  dmv_penalty[10] = '\0';
  dmv_penalty[0xb] = '\0';
  dmv_penalty[0xc] = '\0';
  dmv_penalty[0xd] = '\0';
  dmv_penalty[0xe] = '\0';
  dmv_penalty[0xf] = '\0';
  dmv_qpel_penalty[0x70] = '\0';
  dmv_qpel_penalty[0x71] = '\0';
  dmv_qpel_penalty[0x72] = '\0';
  dmv_qpel_penalty[0x73] = '\0';
  dmv_qpel_penalty[0x74] = '\0';
  dmv_qpel_penalty[0x75] = '\0';
  dmv_qpel_penalty[0x76] = '\0';
  dmv_qpel_penalty[0x77] = '\0';
  dmv_qpel_penalty[0x78] = '\0';
  dmv_qpel_penalty[0x79] = '\0';
  dmv_qpel_penalty[0x7a] = '\0';
  dmv_qpel_penalty[0x7b] = '\0';
  dmv_qpel_penalty[0x7c] = '\0';
  dmv_qpel_penalty[0x7d] = '\0';
  dmv_qpel_penalty[0x7e] = '\0';
  dmv_qpel_penalty[0x7f] = '\0';
  dmv_qpel_penalty[0x60] = '\0';
  dmv_qpel_penalty[0x61] = '\0';
  dmv_qpel_penalty[0x62] = '\0';
  dmv_qpel_penalty[99] = '\0';
  dmv_qpel_penalty[100] = '\0';
  dmv_qpel_penalty[0x65] = '\0';
  dmv_qpel_penalty[0x66] = '\0';
  dmv_qpel_penalty[0x67] = '\0';
  dmv_qpel_penalty[0x68] = '\0';
  dmv_qpel_penalty[0x69] = '\0';
  dmv_qpel_penalty[0x6a] = '\0';
  dmv_qpel_penalty[0x6b] = '\0';
  dmv_qpel_penalty[0x6c] = '\0';
  dmv_qpel_penalty[0x6d] = '\0';
  dmv_qpel_penalty[0x6e] = '\0';
  dmv_qpel_penalty[0x6f] = '\0';
  dmv_qpel_penalty[0x50] = '\0';
  dmv_qpel_penalty[0x51] = '\0';
  dmv_qpel_penalty[0x52] = '\0';
  dmv_qpel_penalty[0x53] = '\0';
  dmv_qpel_penalty[0x54] = '\0';
  dmv_qpel_penalty[0x55] = '\0';
  dmv_qpel_penalty[0x56] = '\0';
  dmv_qpel_penalty[0x57] = '\0';
  dmv_qpel_penalty[0x58] = '\0';
  dmv_qpel_penalty[0x59] = '\0';
  dmv_qpel_penalty[0x5a] = '\0';
  dmv_qpel_penalty[0x5b] = '\0';
  dmv_qpel_penalty[0x5c] = '\0';
  dmv_qpel_penalty[0x5d] = '\0';
  dmv_qpel_penalty[0x5e] = '\0';
  dmv_qpel_penalty[0x5f] = '\0';
  dmv_qpel_penalty[0x40] = '\0';
  dmv_qpel_penalty[0x41] = '\0';
  dmv_qpel_penalty[0x42] = '\0';
  dmv_qpel_penalty[0x43] = '\0';
  dmv_qpel_penalty[0x44] = '\0';
  dmv_qpel_penalty[0x45] = '\0';
  dmv_qpel_penalty[0x46] = '\0';
  dmv_qpel_penalty[0x47] = '\0';
  dmv_qpel_penalty[0x48] = '\0';
  dmv_qpel_penalty[0x49] = '\0';
  dmv_qpel_penalty[0x4a] = '\0';
  dmv_qpel_penalty[0x4b] = '\0';
  dmv_qpel_penalty[0x4c] = '\0';
  dmv_qpel_penalty[0x4d] = '\0';
  dmv_qpel_penalty[0x4e] = '\0';
  dmv_qpel_penalty[0x4f] = '\0';
  dmv_qpel_penalty[0x30] = '\0';
  dmv_qpel_penalty[0x31] = '\0';
  dmv_qpel_penalty[0x32] = '\0';
  dmv_qpel_penalty[0x33] = '\0';
  dmv_qpel_penalty[0x34] = '\0';
  dmv_qpel_penalty[0x35] = '\0';
  dmv_qpel_penalty[0x36] = '\0';
  dmv_qpel_penalty[0x37] = '\0';
  dmv_qpel_penalty[0x38] = '\0';
  dmv_qpel_penalty[0x39] = '\0';
  dmv_qpel_penalty[0x3a] = '\0';
  dmv_qpel_penalty[0x3b] = '\0';
  dmv_qpel_penalty[0x3c] = '\0';
  dmv_qpel_penalty[0x3d] = '\0';
  dmv_qpel_penalty[0x3e] = '\0';
  dmv_qpel_penalty[0x3f] = '\0';
  dmv_qpel_penalty[0x20] = '\0';
  dmv_qpel_penalty[0x21] = '\0';
  dmv_qpel_penalty[0x22] = '\0';
  dmv_qpel_penalty[0x23] = '\0';
  dmv_qpel_penalty[0x24] = '\0';
  dmv_qpel_penalty[0x25] = '\0';
  dmv_qpel_penalty[0x26] = '\0';
  dmv_qpel_penalty[0x27] = '\0';
  dmv_qpel_penalty[0x28] = '\0';
  dmv_qpel_penalty[0x29] = '\0';
  dmv_qpel_penalty[0x2a] = '\0';
  dmv_qpel_penalty[0x2b] = '\0';
  dmv_qpel_penalty[0x2c] = '\0';
  dmv_qpel_penalty[0x2d] = '\0';
  dmv_qpel_penalty[0x2e] = '\0';
  dmv_qpel_penalty[0x2f] = '\0';
  dmv_qpel_penalty[0x10] = '\0';
  dmv_qpel_penalty[0x11] = '\0';
  dmv_qpel_penalty[0x12] = '\0';
  dmv_qpel_penalty[0x13] = '\0';
  dmv_qpel_penalty[0x14] = '\0';
  dmv_qpel_penalty[0x15] = '\0';
  dmv_qpel_penalty[0x16] = '\0';
  dmv_qpel_penalty[0x17] = '\0';
  dmv_qpel_penalty[0x18] = '\0';
  dmv_qpel_penalty[0x19] = '\0';
  dmv_qpel_penalty[0x1a] = '\0';
  dmv_qpel_penalty[0x1b] = '\0';
  dmv_qpel_penalty[0x1c] = '\0';
  dmv_qpel_penalty[0x1d] = '\0';
  dmv_qpel_penalty[0x1e] = '\0';
  dmv_qpel_penalty[0x1f] = '\0';
  dmv_qpel_penalty[0] = '\0';
  dmv_qpel_penalty[1] = '\0';
  dmv_qpel_penalty[2] = '\0';
  dmv_qpel_penalty[3] = '\0';
  dmv_qpel_penalty[4] = '\0';
  dmv_qpel_penalty[5] = '\0';
  dmv_qpel_penalty[6] = '\0';
  dmv_qpel_penalty[7] = '\0';
  dmv_qpel_penalty[8] = '\0';
  dmv_qpel_penalty[9] = '\0';
  dmv_qpel_penalty[10] = '\0';
  dmv_qpel_penalty[0xb] = '\0';
  dmv_qpel_penalty[0xc] = '\0';
  dmv_qpel_penalty[0xd] = '\0';
  dmv_qpel_penalty[0xe] = '\0';
  dmv_qpel_penalty[0xf] = '\0';
  for (lVar26 = 0; lVar26 != 0x80; lVar26 = lVar26 + 1) {
    dmv_penalty[lVar26] = (RK_U8)lVar26;
    RVar14 = exp_golomb_signed((RK_S32)lVar26);
    RVar11 = 0xff;
    if (RVar14 < 0xff) {
      RVar14 = exp_golomb_signed((RK_S32)lVar26);
      RVar11 = (RK_U8)RVar14;
    }
    dmv_qpel_penalty[lVar26] = RVar11;
  }
  for (uVar17 = 0; uVar17 < 0x80; uVar17 = uVar17 + 4) {
    uVar21 = *(uint *)(dmv_penalty + uVar17);
    *(uint *)((long)hal + uVar17 + 0x4e0) =
         uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 | uVar21 << 0x18;
    uVar21 = *(uint *)(dmv_qpel_penalty + uVar17);
    *(uint *)((long)hal + uVar17 + 0x560) =
         uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 | uVar21 << 0x18;
  }
  *(undefined4 *)((long)hal + 0x3c0) = *(undefined4 *)((long)hal + 0x148);
  if (*(RK_U32 *)((long)hal + 0x180) != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 8),0x30,*(RK_U32 *)((long)hal + 0x180));
  }
  *(undefined4 *)((long)hal + 0x3c4) = *(undefined4 *)((long)hal + 0x14c);
  if (*(RK_U32 *)((long)hal + 0x184) != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 8),0x31,*(RK_U32 *)((long)hal + 0x184));
  }
  *(undefined4 *)((long)hal + 0x3c8) = *(undefined4 *)((long)hal + 0x150);
  if (*(RK_U32 *)((long)hal + 0x188) != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 8),0x32,*(RK_U32 *)((long)hal + 0x188));
  }
  pvVar18 = h264e_vepu_buf_get_nal_size_table((HalH264eVepuBufs *)((long)hal + 0x18));
  if (pvVar18 == (MppBuffer)0x0) {
    iVar12 = 0;
  }
  else {
    iVar12 = mpp_buffer_get_fd_with_caller(pvVar18,"hal_h264e_vepu2_gen_regs_v2");
  }
  *(int *)((long)hal + 0x438) = iVar12;
  *(undefined8 *)((long)hal + 0x3fc) = *(undefined8 *)((long)hal + 0x154);
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 8),0x40,*(RK_U32 *)((long)hal + 0x48));
  *(undefined8 *)((long)hal + 0x3e0) = *(undefined8 *)((long)hal + 0x15c);
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 8),0x39,*(RK_U32 *)((long)hal + 0x48));
  *(uint *)((long)hal + 0x49c) =
       (*(uint *)(lVar9 + 0x68) & 3) * 0x40 + ((uVar4 & 0x1ff) << 8 | (uVar5 & 0x1ff) << 0x14) +
       0x31;
  *(int *)((long)hal + 0x10) = *(int *)((long)hal + 0x10) + 1;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu2_v2","leave %p\n","hal_h264e_vepu2_gen_regs_v2",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h264e_vepu2_gen_regs_v2(void *hal, HalEncTask *task)
{
    //MPP_RET ret = MPP_OK;
    HalH264eVepu2Ctx *ctx = (HalH264eVepu2Ctx *)hal;
    HalH264eVepuBufs *hw_bufs = &ctx->hw_bufs;
    HalH264eVepuPrep *hw_prep = &ctx->hw_prep;
    HalH264eVepuAddr *hw_addr = &ctx->hw_addr;
    HalH264eVepuMbRc *hw_mbrc = &ctx->hw_mbrc;
    VepuOffsetCfg *hw_offset = &ctx->hw_offset;
    EncRcTaskInfo *rc_info = &task->rc_task->info;
    EncFrmStatus *frm = &task->rc_task->frm;
    H264eSps *sps = ctx->sps;
    H264ePps *pps = ctx->pps;
    H264eSlice *slice = ctx->slice;
    RK_U32 *reg = ctx->regs_set.val;
    RK_U32 mb_w = ctx->sps->pic_width_in_mbs;
    RK_U32 mb_h = ctx->sps->pic_height_in_mbs;
    RK_U32 offset = mpp_packet_get_length(task->packet);
    RK_U32 first_free_bit = 0;
    RK_U32 val = 0;
    RK_S32 i = 0;

    if (hw_prep->rotation) {
        mb_w = ctx->sps->pic_height_in_mbs;
        mb_h = ctx->sps->pic_width_in_mbs;
    }

    hw_mbrc->qp_init = rc_info->quality_target;
    hw_mbrc->qp_max = rc_info->quality_max;
    hw_mbrc->qp_min = rc_info->quality_min;

    hal_h264e_dbg_func("enter %p\n", hal);

    hal_h264e_dbg_detail("frame %d generate regs now", frm->seq_idx);

    // prepare mb rc config
    h264e_vepu_mbrc_prepare(ctx->rc_ctx, &ctx->hw_mbrc, task->rc_task);
    h264e_vepu_slice_split_cfg(ctx->slice, &ctx->hw_mbrc, task->rc_task, ctx->cfg);

    /* setup output address with offset */
    first_free_bit = setup_output_packet(ctx, reg, task->output, offset);

    /* set extra byte for header */
    hw_mbrc->hdr_strm_size = offset;
    hw_mbrc->hdr_free_size = first_free_bit / 8;
    hw_mbrc->out_strm_size = 0;

    /*
     * The hardware needs only the value for luma plane, because
     * values of other planes are calculated internally based on
     * format setting.
     */
    setup_intra_refresh(ctx, frm);

    val = VEPU_REG_AXI_CTRL_READ_ID(0);
    val |= VEPU_REG_AXI_CTRL_WRITE_ID(0);
    val |= VEPU_REG_AXI_CTRL_BURST_LEN(16);
    val |= VEPU_REG_AXI_CTRL_INCREMENT_MODE(0);
    val |= VEPU_REG_AXI_CTRL_BIRST_DISCARD(0);
    H264E_HAL_SET_REG(reg, VEPU_REG_AXI_CTRL, val);

    H264E_HAL_SET_REG(reg, VEPU_QP_ADJUST_MAD_DELTA_ROI,
                      hw_mbrc->mad_qp_change);

    val = 0;
    if (mb_w * mb_h > 3600)
        val = VEPU_REG_DISABLE_QUARTER_PIXEL_MV;
    val |= VEPU_REG_CABAC_INIT_IDC(slice->cabac_init_idc);
    if (pps->entropy_coding_mode)
        val |= VEPU_REG_ENTROPY_CODING_MODE;
    if (pps->transform_8x8_mode)
        val |= VEPU_REG_H264_TRANS8X8_MODE;
    if (sps->profile_idc > 31)
        val |= VEPU_REG_H264_INTER4X4_MODE;
    /*reg |= VEPU_REG_H264_STREAM_MODE;*/
    val |= VEPU_REG_H264_SLICE_SIZE(hw_mbrc->slice_size_mb_rows);
    H264E_HAL_SET_REG(reg, VEPU_REG_ENC_CTRL0, val);

    RK_U32 scaler = MPP_MAX(1, 200 / (mb_w + mb_h));

    RK_U32 skip_penalty = MPP_MIN(255, h264_skip_sad_penalty[hw_mbrc->qp_init] * scaler);

    RK_U32 overfill_r = (hw_prep->src_w & 0x0f) ?
                        ((16 - (hw_prep->src_w & 0x0f)) / 4) : 0;

    RK_U32 overfill_b = (hw_prep->src_h & 0x0f) ?
                        (16 - (hw_prep->src_h & 0x0f)) : 0;

    val = VEPU_REG_STREAM_START_OFFSET(first_free_bit) |
          VEPU_REG_SKIP_MACROBLOCK_PENALTY(skip_penalty) |
          VEPU_REG_IN_IMG_CTRL_OVRFLR_D4(overfill_r) |
          VEPU_REG_IN_IMG_CTRL_OVRFLB(overfill_b);
    H264E_HAL_SET_REG(reg, VEPU_REG_ENC_OVER_FILL_STRM_OFFSET, val);

    // When offset is zero row length should be total 16 aligned width
    val = VEPU_REG_IN_IMG_CHROMA_OFFSET(0)
          | VEPU_REG_IN_IMG_LUMA_OFFSET(0)
          | VEPU_REG_IN_IMG_CTRL_ROW_LEN(hw_prep->pixel_stride);

    H264E_HAL_SET_REG(reg, VEPU_REG_INPUT_LUMA_INFO, val);

    val = VEPU_REG_CHECKPOINT_CHECK1(hw_mbrc->cp_target[0])
          | VEPU_REG_CHECKPOINT_CHECK0(hw_mbrc->cp_target[1]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHECKPOINT(0), val);

    val = VEPU_REG_CHECKPOINT_CHECK1(hw_mbrc->cp_target[2])
          | VEPU_REG_CHECKPOINT_CHECK0(hw_mbrc->cp_target[3]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHECKPOINT(1), val);

    val = VEPU_REG_CHECKPOINT_CHECK1(hw_mbrc->cp_target[4])
          | VEPU_REG_CHECKPOINT_CHECK0(hw_mbrc->cp_target[5]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHECKPOINT(2), val);

    val = VEPU_REG_CHECKPOINT_CHECK1(hw_mbrc->cp_target[6])
          | VEPU_REG_CHECKPOINT_CHECK0(hw_mbrc->cp_target[7]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHECKPOINT(3), val);

    val = VEPU_REG_CHECKPOINT_CHECK1(hw_mbrc->cp_target[8])
          | VEPU_REG_CHECKPOINT_CHECK0(hw_mbrc->cp_target[9]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHECKPOINT(4), val);

    val = VEPU_REG_CHKPT_WORD_ERR_CHK1(hw_mbrc->cp_error[0])
          | VEPU_REG_CHKPT_WORD_ERR_CHK0(hw_mbrc->cp_error[1]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHKPT_WORD_ERR(0), val);

    val = VEPU_REG_CHKPT_WORD_ERR_CHK1(hw_mbrc->cp_error[2])
          | VEPU_REG_CHKPT_WORD_ERR_CHK0(hw_mbrc->cp_error[3]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHKPT_WORD_ERR(1), val);

    val = VEPU_REG_CHKPT_WORD_ERR_CHK1(hw_mbrc->cp_error[4])
          | VEPU_REG_CHKPT_WORD_ERR_CHK0(hw_mbrc->cp_error[5]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHKPT_WORD_ERR(2), val);

    val = VEPU_REG_CHKPT_DELTA_QP_CHK6(hw_mbrc->cp_delta_qp[6])
          | VEPU_REG_CHKPT_DELTA_QP_CHK5(hw_mbrc->cp_delta_qp[5])
          | VEPU_REG_CHKPT_DELTA_QP_CHK4(hw_mbrc->cp_delta_qp[4])
          | VEPU_REG_CHKPT_DELTA_QP_CHK3(hw_mbrc->cp_delta_qp[3])
          | VEPU_REG_CHKPT_DELTA_QP_CHK2(hw_mbrc->cp_delta_qp[2])
          | VEPU_REG_CHKPT_DELTA_QP_CHK1(hw_mbrc->cp_delta_qp[1])
          | VEPU_REG_CHKPT_DELTA_QP_CHK0(hw_mbrc->cp_delta_qp[0]);
    H264E_HAL_SET_REG(reg, VEPU_REG_CHKPT_DELTA_QP, val);

    val = VEPU_REG_MAD_THRESHOLD(hw_mbrc->mad_threshold)
          | VEPU_REG_IN_IMG_CTRL_FMT(hw_prep->src_fmt)
          | VEPU_REG_IN_IMG_ROTATE_MODE(hw_prep->rotation)
          | VEPU_REG_SIZE_TABLE_PRESENT; //FIXED
    H264E_HAL_SET_REG(reg, VEPU_REG_ENC_CTRL1, val);

    val = VEPU_REG_INTRA16X16_MODE(h264_intra16_favor[hw_mbrc->qp_init])
          | VEPU_REG_INTER_MODE(h264_inter_favor[hw_mbrc->qp_init]);
    H264E_HAL_SET_REG(reg, VEPU_REG_INTRA_INTER_MODE, val);

    val = VEPU_REG_PPS_INIT_QP(pps->pic_init_qp)
          | VEPU_REG_SLICE_FILTER_ALPHA(slice->slice_alpha_c0_offset_div2)
          | VEPU_REG_SLICE_FILTER_BETA(slice->slice_beta_offset_div2)
          | VEPU_REG_CHROMA_QP_OFFSET(pps->chroma_qp_index_offset)
          | VEPU_REG_IDR_PIC_ID(slice->idr_pic_id);

    if (slice->disable_deblocking_filter_idc)
        val |= VEPU_REG_FILTER_DISABLE;

    if (pps->constrained_intra_pred)
        val |= VEPU_REG_CONSTRAINED_INTRA_PREDICTION;
    H264E_HAL_SET_REG(reg, VEPU_REG_ENC_CTRL2, val);

    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_NEXT_PIC, 0);
    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_MV_OUT, 0);

    MppBuffer cabac_table = hw_bufs->cabac_table;
    RK_S32 cabac_table_fd = cabac_table ? mpp_buffer_get_fd(cabac_table) : 0;

    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_CABAC_TBL, cabac_table_fd);

    val = VEPU_REG_ROI1_TOP_MB(mb_h)
          | VEPU_REG_ROI1_BOTTOM_MB(mb_h)
          | VEPU_REG_ROI1_LEFT_MB(mb_w)
          | VEPU_REG_ROI1_RIGHT_MB(mb_w);
    H264E_HAL_SET_REG(reg, VEPU_REG_ROI1, val);

    val = VEPU_REG_ROI2_TOP_MB(mb_h)
          | VEPU_REG_ROI2_BOTTOM_MB(mb_h)
          | VEPU_REG_ROI2_LEFT_MB(mb_w)
          | VEPU_REG_ROI2_RIGHT_MB(mb_w);
    H264E_HAL_SET_REG(reg, VEPU_REG_ROI2, val);
    H264E_HAL_SET_REG(reg, VEPU_REG_STABLILIZATION_OUTPUT, 0);

    val = VEPU_REG_RGB2YUV_CONVERSION_COEFB(hw_prep->color_conversion_coeff_b)
          | VEPU_REG_RGB2YUV_CONVERSION_COEFA(hw_prep->color_conversion_coeff_a);
    H264E_HAL_SET_REG(reg, VEPU_REG_RGB2YUV_CONVERSION_COEF1, val);

    val = VEPU_REG_RGB2YUV_CONVERSION_COEFE(hw_prep->color_conversion_coeff_e)
          | VEPU_REG_RGB2YUV_CONVERSION_COEFC(hw_prep->color_conversion_coeff_c);
    H264E_HAL_SET_REG(reg, VEPU_REG_RGB2YUV_CONVERSION_COEF2, val);

    val = VEPU_REG_RGB2YUV_CONVERSION_COEFF(hw_prep->color_conversion_coeff_f);
    H264E_HAL_SET_REG(reg, VEPU_REG_RGB2YUV_CONVERSION_COEF3, val);

    val = VEPU_REG_RGB_MASK_B_MSB(hw_prep->b_mask_msb)
          | VEPU_REG_RGB_MASK_G_MSB(hw_prep->g_mask_msb)
          | VEPU_REG_RGB_MASK_R_MSB(hw_prep->r_mask_msb);
    H264E_HAL_SET_REG(reg, VEPU_REG_RGB_MASK_MSB, val); //FIXED

    {
        RK_U32 diff_mv_penalty[3] = {0};
        diff_mv_penalty[0] = h264_diff_mv_penalty4p[hw_mbrc->qp_init];
        diff_mv_penalty[1] = h264_diff_mv_penalty[hw_mbrc->qp_init];
        diff_mv_penalty[2] = h264_diff_mv_penalty[hw_mbrc->qp_init];

        val = VEPU_REG_1MV_PENALTY(diff_mv_penalty[1])
              | VEPU_REG_QMV_PENALTY(diff_mv_penalty[2])
              | VEPU_REG_4MV_PENALTY(diff_mv_penalty[0]);
    }

    val |= VEPU_REG_SPLIT_MV_MODE_EN;
    H264E_HAL_SET_REG(reg, VEPU_REG_MV_PENALTY, val);

    val = VEPU_REG_H264_LUMA_INIT_QP(hw_mbrc->qp_init)
          | VEPU_REG_H264_QP_MAX(hw_mbrc->qp_max)
          | VEPU_REG_H264_QP_MIN(hw_mbrc->qp_min)
          | VEPU_REG_H264_CHKPT_DISTANCE(hw_mbrc->cp_distance_mbs);
    H264E_HAL_SET_REG(reg, VEPU_REG_QP_VAL, val);

    val = VEPU_REG_ZERO_MV_FAVOR_D2(10);
    H264E_HAL_SET_REG(reg, VEPU_REG_MVC_RELATE, val);

    val = VEPU_REG_OUTPUT_SWAP32
          | VEPU_REG_OUTPUT_SWAP16
          | VEPU_REG_OUTPUT_SWAP8
          | VEPU_REG_INPUT_SWAP8_(hw_prep->swap_8_in)
          | VEPU_REG_INPUT_SWAP16_(hw_prep->swap_16_in)
          | VEPU_REG_INPUT_SWAP32_(hw_prep->swap_32_in);
    H264E_HAL_SET_REG(reg, VEPU_REG_DATA_ENDIAN, val);

    val = VEPU_REG_PPS_ID(pps->pps_id)
          | VEPU_REG_INTRA_PRED_MODE(h264_prev_mode_favor[hw_mbrc->qp_init])
          | VEPU_REG_FRAME_NUM(slice->frame_num);
    H264E_HAL_SET_REG(reg, VEPU_REG_ENC_CTRL3, val);

    val = VEPU_REG_INTERRUPT_TIMEOUT_EN;
    H264E_HAL_SET_REG(reg, VEPU_REG_INTERRUPT, val);

    {
        RK_U8 dmv_penalty[128] = {0};
        RK_U8 dmv_qpel_penalty[128] = {0};

        for (i = 0; i < 128; i++) {
            dmv_penalty[i] = i;
            dmv_qpel_penalty[i] = MPP_MIN(255, exp_golomb_signed(i));
        }

        for (i = 0; i < 128; i += 4) {
            val = VEPU_REG_DMV_PENALTY_TABLE_BIT(dmv_penalty[i], 3);
            val |= VEPU_REG_DMV_PENALTY_TABLE_BIT(dmv_penalty[i + 1], 2);
            val |= VEPU_REG_DMV_PENALTY_TABLE_BIT(dmv_penalty[i + 2], 1);
            val |= VEPU_REG_DMV_PENALTY_TABLE_BIT(dmv_penalty[i + 3], 0);
            H264E_HAL_SET_REG(reg, VEPU_REG_DMV_PENALTY_TBL(i / 4), val);

            val = VEPU_REG_DMV_Q_PIXEL_PENALTY_TABLE_BIT(
                      dmv_qpel_penalty[i], 3);
            val |= VEPU_REG_DMV_Q_PIXEL_PENALTY_TABLE_BIT(
                       dmv_qpel_penalty[i + 1], 2);
            val |= VEPU_REG_DMV_Q_PIXEL_PENALTY_TABLE_BIT(
                       dmv_qpel_penalty[i + 2], 1);
            val |= VEPU_REG_DMV_Q_PIXEL_PENALTY_TABLE_BIT(
                       dmv_qpel_penalty[i + 3], 0);
            H264E_HAL_SET_REG(reg, VEPU_REG_DMV_Q_PIXEL_PENALTY_TBL(i / 4), val);
        }
    }

    /* set buffers addr */
    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_IN_LUMA, hw_addr->orig[0]);
    if (hw_offset->offset_byte[0])
        mpp_dev_set_reg_offset(ctx->dev, VEPU_REG_ADDR_IN_LUMA >> 2,
                               hw_offset->offset_byte[0]);
    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_IN_CB, hw_addr->orig[1]);
    if (hw_offset->offset_byte[1])
        mpp_dev_set_reg_offset(ctx->dev, VEPU_REG_ADDR_IN_CB >> 2,
                               hw_offset->offset_byte[1]);
    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_IN_CR, hw_addr->orig[2]);
    if (hw_offset->offset_byte[2])
        mpp_dev_set_reg_offset(ctx->dev, VEPU_REG_ADDR_IN_CR >> 2,
                               hw_offset->offset_byte[2]);

    MppBuffer nal_size_table = h264e_vepu_buf_get_nal_size_table(hw_bufs);
    RK_S32 nal_size_table_fd = nal_size_table ? mpp_buffer_get_fd(nal_size_table) : 0;

    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_OUTPUT_CTRL, nal_size_table_fd);

    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_REC_LUMA,   hw_addr->recn[0]);
    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_REC_CHROMA, hw_addr->recn[1]);
    mpp_dev_set_reg_offset(ctx->dev, VEPU_REG_ADDR_REC_CHROMA >> 2, hw_bufs->yuv_size);
    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_REF_LUMA,   hw_addr->refr[0]);
    H264E_HAL_SET_REG(reg, VEPU_REG_ADDR_REF_CHROMA, hw_addr->refr[1]);
    mpp_dev_set_reg_offset(ctx->dev, VEPU_REG_ADDR_REF_CHROMA >> 2, hw_bufs->yuv_size);

    /* set important encode mode info */
    val = VEPU_REG_MB_HEIGHT(mb_h)
          | VEPU_REG_MB_WIDTH(mb_w)
          | VEPU_REG_PIC_TYPE(slice->idr_flag)
          | VEPU_REG_ENCODE_FORMAT(3)
          | VEPU_REG_ENCODE_ENABLE;
    H264E_HAL_SET_REG(reg, VEPU_REG_ENCODE_START, val);

    ctx->frame_cnt++;

    hal_h264e_dbg_func("leave %p\n", hal);
    return MPP_OK;
}